

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void fill_advent_calendar(level *lev,boolean init)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  uint uVar6;
  int otyp;
  char *line;
  boolean init_00;
  boolean artif;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char buf [4];
  char local_3c [4];
  uint *local_38;
  
  puVar5 = (uint *)&lev->locations[1][1].field_0x6;
  uVar6 = 1;
  lVar9 = 1;
  do {
    uVar7 = 0;
    local_38 = puVar5;
    do {
      uVar8 = uVar7 + 1;
      if (((int)uVar6 < 0x19) && (*(byte *)((long)puVar5 + -2) == 0x17)) {
        uVar1 = uVar7;
        if (9 < uVar8) {
          uVar1 = uVar7 + 2;
        }
        if (init != '\0') {
          if (uVar8 < 10) {
            uVar7 = uVar7 + 2;
          }
          sprintf(local_3c,"%d",(ulong)uVar6);
          iVar4 = (int)lVar9;
          make_engr_at(lev,iVar4,(int)uVar7,local_3c,0,'\x04');
          uVar2 = mt_random();
          if (uVar6 == 0x18) {
            otyp = *(int *)(&DAT_002b52f8 + (ulong)(uVar2 % 0xf) * 4);
            init_00 = '\x01';
            artif = '\x01';
          }
          else {
            uVar3 = mt_random();
            if ((uVar2 & 3) == 0) {
              mkobj_at(((uVar3 & 3) == 0) * '\x02' + '\x04',lev,iVar4,(int)uVar1,'\0');
              goto LAB_001dce74;
            }
            otyp = ((uVar3 & 3) == 0) + 0x121;
            init_00 = '\0';
            artif = '\0';
          }
          mksobj_at(otyp,lev,iVar4,(int)uVar1,init_00,artif);
        }
LAB_001dce74:
        if ((*puVar5 & 0x80) != 0) {
          iVar4 = getmonth();
          if (iVar4 == 0xc) {
            iVar4 = getmday();
            line = "a little bell ringing!";
            if (uVar6 != 0x18 || iVar4 != 0x18) {
              uVar2 = getmday();
              line = "a door unlocking!";
              if (uVar2 != uVar6) goto LAB_001dcec0;
            }
            You_hear(line);
            *puVar5 = *puVar5 & 0xfffffe0f | 0x40;
          }
        }
LAB_001dcec0:
        uVar6 = uVar6 + 1;
      }
      puVar5 = puVar5 + 3;
      uVar7 = uVar8;
    } while (uVar8 != 0x14);
    lVar9 = lVar9 + 1;
    puVar5 = local_38 + 0x3f;
    if (lVar9 == 0x50) {
      return;
    }
  } while( true );
}

Assistant:

void fill_advent_calendar(struct level *lev, boolean init)
{
    int door_nr = 1;
    char buf[4];
    int x, y;
    int in_x, in_y, out_x, out_y;

    for (x = 1; x < COLNO; x++) {
	for (y = 1; y < ROWNO; y++) {
	    if (door_nr < 25 && isok(x,y) && IS_DOOR(lev->locations[x][y].typ)) {
		if (y < 10) {
		    out_x = x; out_y = y+1; in_x = x; in_y = y-1;
		} else {
		    out_x = x; out_y = y-1; in_x = x; in_y = y+1;
		}
		if (init) {
		    sprintf(buf, "%d", door_nr);
		    /* place number in front of the door */
		    make_engr_at(lev, out_x, out_y, buf, 0L, MARK);
		    if (door_nr == 24) {
			int object = CANDY_BAR;
			/* Christmas present! */
			switch (rn2(15)) {
			case  0: object = BAG_OF_HOLDING; break;
			case  1: object = OILSKIN_SACK; break;
			case  2: object = FIRE_HORN; break;
			case  3: object = FROST_HORN; break;
			case  4: object = MAGIC_FLUTE; break;
			case  5: object = MAGIC_HARP; break;
			case  6: object = DRUM_OF_EARTHQUAKE; break;
			case  7: object = MAGIC_WHISTLE; break;
			case  8: object = MAGIC_LAMP; break;
			case  9: object = UNICORN_HORN; break;
			case 10: object = BAG_OF_TRICKS; break;
			case 11: object = EXPENSIVE_CAMERA; break;
			case 12: object = HORN_OF_PLENTY; break;
			case 13: object = STETHOSCOPE; break;
			case 14: object = TINNING_KIT; break;
			}
			mksobj_at(object, lev, in_x, in_y, TRUE, TRUE);
		    } else if (rn2(4)) {
			mksobj_at((rn2(4)) ? CANDY_BAR : FORTUNE_COOKIE,
				  lev, in_x, in_y, FALSE, FALSE);
		    } else {
			mkobj_at((rn2(4)) ? RING_CLASS : TOOL_CLASS,
				 lev, in_x, in_y, FALSE);
		    }
		}
		if (lev->locations[x][y].doormask & D_LOCKED && getmonth() == 12) {
		    if (getmday() == 24 && door_nr == 24) {
			You_hear("a little bell ringing!");
			lev->locations[x][y].doormask = D_CLOSED;
		    } else if (getmday() == door_nr) {
			You_hear("a door unlocking!");
			lev->locations[x][y].doormask = D_CLOSED;
		    }
		}
		door_nr++;
	    }
	}
    }
}